

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

void __thiscall QDebug::QDebug(QDebug *this,QString *string)

{
  Data *pDVar1;
  Stream *in_RSI;
  QString *in_RDI;
  
  pDVar1 = (Data *)operator_new(0x58);
  Stream::Stream(in_RSI,in_RDI);
  (in_RDI->d).d = pDVar1;
  return;
}

Assistant:

explicit QDebug(QString *string) : stream(new Stream(string)) {}